

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
avro::toBin(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,string *s)

{
  pointer puVar1;
  pointer pcVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  long lVar4;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (__return_storage_ptr__,s->_M_string_length);
  pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)s->_M_string_length;
  if (0 < (long)pvVar3) {
    puVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (s->_M_dataplus)._M_p;
    pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&(pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start + 1);
    lVar4 = 0;
    do {
      puVar1[lVar4] = pcVar2[lVar4];
      pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)pvVar3 + 0xffffffffffffffff);
      lVar4 = lVar4 + 1;
    } while (1 < pvVar3);
  }
  return pvVar3;
}

Assistant:

static vector<uint8_t> toBin(const std::string& s)
{
    vector<uint8_t> result;
    result.resize(s.size());
    std::copy(s.c_str(), s.c_str() + s.size(), &result[0]);
    return result;
}